

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
::add_knowing_refcount_is_zero
          (FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
           *this,Block *node)

{
  int iVar1;
  bool bVar2;
  long in_RSI;
  memory_order in_stack_00000010;
  memory_order in_stack_00000014;
  __pointer_type in_stack_00000018;
  __pointer_type *in_stack_00000020;
  atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
  *in_stack_00000028;
  __pointer_type head;
  memory_order __b;
  int *in_stack_ffffffffffffff90;
  __pointer_type in_stack_ffffffffffffff98;
  atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
  *in_stack_ffffffffffffffa0;
  
  std::
  atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
  ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
          *)in_stack_ffffffffffffff98,(memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  do {
    std::
    atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
    ::store(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
            (memory_order)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    in_stack_ffffffffffffffa0 =
         (atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
          *)(in_RSI + 0x130);
    std::operator&(release,__memory_order_mask);
    *(undefined4 *)&(in_stack_ffffffffffffffa0->_M_b)._M_p = 1;
    bVar2 = std::
            atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
            ::compare_exchange_strong
                      (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014,
                       in_stack_00000010);
    if (bVar2) {
      return;
    }
    in_stack_ffffffffffffff90 = (int *)(in_RSI + 0x130);
    in_stack_ffffffffffffff98 = (__pointer_type)0x2;
    LOCK();
    iVar1 = *in_stack_ffffffffffffff90;
    *in_stack_ffffffffffffff90 = *in_stack_ffffffffffffff90 + 0x7fffffff;
    UNLOCK();
  } while (iVar1 == 1);
  return;
}

Assistant:

inline void add_knowing_refcount_is_zero(N* node) {
      // Since the refcount is zero, and nobody can increase it once it's zero
      // (except us, and we run only one copy of this method per node at a time,
      // i.e. the single thread case), then we know we can safely change the
      // next pointer of the node; however, once the refcount is back above
      // zero, then other threads could increase it (happens under heavy
      // contention, when the refcount goes to zero in between a load and a
      // refcount increment of a node in try_get, then back up to something
      // non-zero, then the refcount increment is done by the other thread) --
      // so, if the CAS to add the node to the actual list fails, decrease the
      // refcount and leave the add operation to the next thread who puts the
      // refcount back at zero (which could be us, hence the loop).
      auto head = freeListHead.load(std::memory_order_relaxed);
      while (true) {
        node->freeListNext.store(head, std::memory_order_relaxed);
        node->freeListRefs.store(1, std::memory_order_release);
        if (!freeListHead.compare_exchange_strong(head, node,
                                                  std::memory_order_release,
                                                  std::memory_order_relaxed)) {
          // Hmm, the add failed, but we can only try again when the refcount
          // goes back to zero
          if (node->freeListRefs.fetch_add(SHOULD_BE_ON_FREELIST - 1,
                                           std::memory_order_release) == 1) {
            continue;
          }
        }
        return;
      }
    }